

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char * load_program(void)

{
  FILE *__stream;
  size_t __n;
  char *program;
  long size;
  FILE *file;
  
  __stream = fopen("tests/test.ch","rb");
  fseek(__stream,0,2);
  __n = ftell(__stream);
  fseek(__stream,0,0);
  if (__n == 0xffffffffffffffff) {
    file = (FILE *)0x0;
  }
  else {
    file = (FILE *)malloc(__n + 1);
    fread(file,1,__n,__stream);
    fclose(__stream);
    *(undefined1 *)((long)&file->_flags + __n) = 0;
  }
  return (char *)file;
}

Assistant:

char *load_program() {
  FILE *file = fopen("tests/test.ch", "rb");
  fseek(file, 0, SEEK_END);
  long size = ftell(file);
  fseek(file, 0, SEEK_SET);

  if (size == -1) {
    return NULL;
  }

  char *program = malloc(size + 1);
  fread(program, 1, size, file);
  fclose(file);

  program[size] = 0;

  return program;
}